

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void __thiscall
lodepng::ExtractZlib::inflateNoCompression
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
          size_t *bp,size_t *pos,size_t inlength)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  long lVar5;
  value_type_conflict1 *__x;
  size_t sVar6;
  
  sVar6 = *bp;
  while ((sVar6 & 7) != 0) {
    sVar6 = sVar6 + 1;
    *bp = sVar6;
  }
  uVar4 = sVar6 >> 3;
  if (uVar4 < inlength - 4) {
    bVar1 = in[uVar4];
    bVar2 = in[uVar4 + 1];
    uVar3 = CONCAT11(bVar2,bVar1);
    if ((uint)*(ushort *)(in + uVar4 + 2) + (uint)uVar3 == 0xffff) {
      if (inlength < uVar3 + uVar4 + 4) {
        this->error = 0x17;
      }
      else {
        __x = in + uVar4 + 4;
        for (lVar5 = 0; (ulong)((uint)bVar2 * 0x800 + (uint)bVar1 * 8) + lVar5 != 0;
            lVar5 = lVar5 + -8) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(out,__x);
          *pos = *pos + 1;
          __x = __x + 1;
        }
        *bp = ((sVar6 & 0xfffffffffffffff8) - lVar5) + 0x20;
      }
    }
    else {
      this->error = 0x15;
    }
  }
  else {
    this->error = 0x34;
  }
  return;
}

Assistant:

void inflateNoCompression(std::vector<unsigned char>& out,
                            const unsigned char* in, size_t& bp, size_t& pos, size_t inlength) {
    while((bp & 0x7) != 0) bp++; //go to first boundary of byte
    size_t p = bp / 8;
    if(p >= inlength - 4) { error = 52; return; } //error, bit pointer will jump past memory
    unsigned long LEN = in[p] + 256u * in[p + 1], NLEN = in[p + 2] + 256u * in[p + 3]; p += 4;
    if(LEN + NLEN != 65535) { error = 21; return; } //error: NLEN is not one's complement of LEN
    if(p + LEN > inlength) { error = 23; return; } //error: reading outside of in buffer
    for(unsigned long n = 0; n < LEN; n++) {
      out.push_back(in[p++]); //read LEN bytes of literal data
      pos++;
    }
    bp = p * 8;
  }